

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O1

int64_t __thiscall libtorrent::aux::torrent_peer::total_upload(torrent_peer *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->connection != (peer_connection_interface *)0x0) {
    iVar1 = (*this->connection->_vptr_peer_connection_interface[0xf])();
    return *(int64_t *)CONCAT44(extraout_var,iVar1);
  }
  return (ulong)this->prev_amount_upload << 10;
}

Assistant:

std::int64_t torrent_peer::total_upload() const
	{
		TORRENT_ASSERT(in_use);
		if (connection != nullptr)
		{
			TORRENT_ASSERT(prev_amount_upload == 0);
			return connection->statistics().total_payload_upload();
		}
		else
		{
			return std::int64_t(prev_amount_upload) * 1024;
		}
	}